

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

string * __thiscall
CLParam<bool>::getFullParamName_abi_cxx11_(string *__return_storage_ptr__,CLParam<bool> *this)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_90 = &local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"-","");
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_90,*(ulong *)(this + 8));
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if ('\n' < (char)this[0x28]) {
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
    plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_60 = *plVar4;
      lStack_58 = plVar2[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar4;
      local_70 = (long *)*plVar2;
    }
    local_68 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_70,(ulong)(__return_storage_ptr__->_M_dataplus)._M_p)
    ;
    plVar4 = plVar2 + 2;
    if ((long *)*plVar2 == plVar4) {
      local_80 = *plVar4;
      lStack_78 = plVar2[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar4;
      local_90 = (long *)*plVar2;
    }
    local_88 = plVar2[1];
    *plVar2 = (long)plVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getFullParamName()
    {
        std::string fullname = std::string("-")+parameter_name ;
        if (parameter_name_short > 10) {
            fullname = getShortParamNameStr()+", -"+fullname ;
        }
        return fullname ;
    }